

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_list.c
# Opt level: O3

int cmime_list_map_new(CMimeList_T *list,CMimeList_T **new_list,
                      _func_void_ptr_CMimeListElem_T_ptr_void_ptr *func,void *args)

{
  int iVar1;
  CMimeList_T *pCVar2;
  void *data;
  CMimeListElem_T *pCVar3;
  
  if (list != (CMimeList_T *)0x0) {
    pCVar2 = (CMimeList_T *)calloc(1,0x20);
    *new_list = pCVar2;
    if (pCVar2 == (CMimeList_T *)0x0) {
      iVar1 = -1;
    }
    else {
      pCVar3 = list->head;
      iVar1 = 0;
      if (pCVar3 != (CMimeListElem_T *)0x0) {
        do {
          pCVar2 = *new_list;
          data = (*func)(pCVar3,args);
          cmime_list_append(pCVar2,data);
          pCVar3 = pCVar3->next;
        } while (pCVar3 != (_CMimeListElem *)0x0);
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_list.c"
                ,0xf1,
                "int cmime_list_map_new(CMimeList_T *, CMimeList_T **, void *(*)(CMimeListElem_T *, void *), void *)"
               );
}

Assistant:

int cmime_list_map_new(CMimeList_T *list, CMimeList_T **new_list, void *(*func)(CMimeListElem_T *elem,
        void *args), void *args) {
    CMimeListElem_T *elem;
    int ret;
 
    assert(list);

    ret = cmime_list_new(new_list, NULL);
    if(ret != 0) {
        return(-1);
    }
 
    elem = cmime_list_head(list);
    while(elem != NULL) {
        cmime_list_append(*new_list,func(elem,args));
        elem = elem->next;
    }
 
    return(0);
}